

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O2

Rect __thiscall lunasvg::SVGEllipseElement::updateShape(SVGEllipseElement *this,Path *path)

{
  float rx;
  float ry;
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  Rect RVar4;
  LengthContext lengthContext;
  LengthContext local_28;
  
  local_28.m_units = UserSpaceOnUse;
  local_28.m_element = (SVGElement *)this;
  rx = LengthContext::valueForLength(&local_28,&this->m_rx);
  ry = LengthContext::valueForLength(&local_28,&this->m_ry);
  if ((rx <= 0.0) || (ry <= 0.0)) {
    fVar1 = 0.0;
    fVar2 = 0.0;
    uVar3 = 0;
  }
  else {
    fVar1 = LengthContext::valueForLength(&local_28,&this->m_cx);
    fVar2 = LengthContext::valueForLength(&local_28,&this->m_cy);
    Path::addEllipse(path,fVar1,fVar2,rx,ry);
    fVar1 = fVar1 - rx;
    fVar2 = fVar2 - ry;
    uVar3 = CONCAT44(ry + ry,rx + rx);
  }
  RVar4.y = fVar2;
  RVar4.x = fVar1;
  RVar4.w = (float)(int)uVar3;
  RVar4.h = (float)(int)((ulong)uVar3 >> 0x20);
  return RVar4;
}

Assistant:

Rect SVGEllipseElement::updateShape(Path& path)
{
    LengthContext lengthContext(this);
    auto rx = lengthContext.valueForLength(m_rx);
    auto ry = lengthContext.valueForLength(m_ry);
    if(rx <= 0.f || ry <= 0.f) {
        return Rect::Empty;
    }

    auto cx = lengthContext.valueForLength(m_cx);
    auto cy = lengthContext.valueForLength(m_cy);
    path.addEllipse(cx, cy, rx, ry);
    return Rect(cx - rx, cy - ry, rx + rx, ry + ry);
}